

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathsimplifier.cpp
# Opt level: O0

uint anon_unknown.dwarf_d7297f::gcd(uint x,uint y)

{
  uint uVar1;
  uint z;
  uint y_local;
  uint x_local;
  
  y_local = y;
  x_local = x;
  while (y_local != 0) {
    uVar1 = x_local % y_local;
    x_local = y_local;
    y_local = uVar1;
  }
  return x_local;
}

Assistant:

inline unsigned int gcd(unsigned int x, unsigned int y)
{
    while (y != 0) {
        unsigned int z = y;
        y = x % y;
        x = z;
    }
    return x;
}